

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_202012.hpp
# Opt level: O0

string * jsoncons::jsonschema::draft202012::
         schema_validator_factory_202012<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
         ::validation_id_abi_cxx11_(void)

{
  int iVar1;
  allocator<char> *in_stack_00000010;
  char *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  allocator<char> local_1;
  
  if (validation_id[abi:cxx11]()::id_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&validation_id[abi:cxx11]()::id_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_00000020,in_stack_00000018,in_stack_00000010);
      std::allocator<char>::~allocator(&local_1);
      __cxa_atexit(std::__cxx11::string::~string,&validation_id[abi:cxx11]()::id_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&validation_id[abi:cxx11]()::id_abi_cxx11_);
    }
  }
  return &validation_id[abi:cxx11]()::id_abi_cxx11_;
}

Assistant:

static const std::string& validation_id()
        {
            static std::string id = "https://json-schema.org/draft/2020-12/vocab/validation";
            return id;
        }